

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O3

size_t fiobj_str_readfile(FIOBJ dest,char *filename,intptr_t start_at,intptr_t limit)

{
  fio_str_s_conflict *s;
  int iVar1;
  char *__s;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong needed;
  ulong uVar8;
  long lVar9;
  fio_str_info_s local_d8;
  stat local_c0;
  
  if (filename == (char *)0x0) {
    return 0;
  }
  if ((*filename == '~') &&
     (((filename[1] == '\\' || (filename[1] == '/')) && (__s = getenv("HOME"), __s != (char *)0x0)))
     ) {
    sVar2 = strlen(filename);
    sVar3 = strlen(__s);
    uVar5 = sVar3 + sVar2;
    if (0xffff < uVar5) {
      return 0;
    }
    if ((__s[sVar3 - 1] == '\\') || (__s[sVar3 - 1] == '/')) {
      uVar5 = (sVar3 + sVar2) - 1;
      sVar3 = sVar3 - 1;
    }
    __dest = (char *)fio_malloc(uVar5);
    if (__dest == (char *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.h:4497"
                      );
      }
      kill(0,2);
      piVar4 = __errno_location();
      exit(*piVar4);
    }
    memcpy(__dest,__s,sVar3);
    memcpy(__dest + sVar3,filename + 1,sVar2);
    __dest[uVar5 - 1] = '\0';
    filename = __dest;
  }
  else {
    __dest = (char *)0x0;
  }
  iVar1 = stat(filename,&local_c0);
  if (iVar1 != 0) {
    uVar5 = 0;
    goto LAB_00120116;
  }
  uVar8 = dest & 0xfffffffffffffff8;
  s = (fio_str_s_conflict *)(uVar8 + 0x10);
  if (local_c0.st_size < 1 || local_c0.st_size <= start_at) {
    if ((s->small == 0) && (*(long *)(uVar8 + 0x38) != 0)) {
      uVar5 = *(ulong *)(uVar8 + 0x28);
    }
    else {
      uVar5 = (ulong)(s->small >> 1);
    }
    goto LAB_00120116;
  }
  uVar5 = 0;
  iVar1 = open(filename,0);
  if (iVar1 == -1) goto LAB_00120116;
  lVar9 = 0;
  if (0 < local_c0.st_size + start_at) {
    lVar9 = local_c0.st_size + start_at;
  }
  if (-1 < start_at) {
    lVar9 = start_at;
  }
  sVar2 = limit;
  if ((ulong)local_c0.st_size < (ulong)(lVar9 + limit)) {
    sVar2 = local_c0.st_size - lVar9;
  }
  if (limit < 1) {
    sVar2 = local_c0.st_size - lVar9;
  }
  if (s->small == 0) {
    lVar7 = *(long *)(uVar8 + 0x38);
    if (lVar7 == 0) {
      needed = 0;
      uVar5 = sVar2;
      if (*(char *)(uVar8 + 0x11) != '\0') goto LAB_001201c6;
      goto LAB_00120226;
    }
    needed = *(ulong *)(uVar8 + 0x28);
    uVar5 = needed;
    if (*(char *)(uVar8 + 0x11) != '\0') goto LAB_001202a2;
    uVar5 = needed + sVar2;
    if (*(ulong *)(uVar8 + 0x20) <= uVar5) {
      uVar6 = *(ulong *)(uVar8 + 0x20);
      if (*(long *)(uVar8 + 0x30) == 0) {
        uVar6 = needed;
      }
      *(ulong *)(uVar8 + 0x28) = uVar6;
      goto LAB_0012027d;
    }
LAB_00120291:
    *(ulong *)(uVar8 + 0x28) = uVar5;
    *(undefined1 *)(*(long *)(uVar8 + 0x38) + uVar5) = 0;
    lVar7 = *(long *)(uVar8 + 0x38);
  }
  else {
    needed = (ulong)(s->small >> 1);
    if (*(char *)(uVar8 + 0x11) == '\0') {
      uVar5 = needed + sVar2;
LAB_00120226:
      if (0x2d < uVar5) {
        s->small = '[';
LAB_0012027d:
        fio_str_capa_assert(&local_d8,s,uVar5);
        goto LAB_00120291;
      }
      *(char *)(uVar8 + 0x10) = (char)uVar5 * '\x02' + '\x01';
      lVar7 = uVar8 + 0x12;
      *(undefined1 *)(uVar8 + 0x12 + uVar5) = 0;
    }
    else {
LAB_001201c6:
      lVar7 = uVar8 + 0x12;
      uVar5 = needed;
    }
  }
LAB_001202a2:
  sVar3 = pread(iVar1,(void *)(lVar7 + needed),sVar2,lVar9);
  if (sVar3 != sVar2) {
    if (*(char *)(uVar8 + 0x11) == '\0') {
      if ((s->small == '\0') && (*(long *)(uVar8 + 0x38) != 0)) {
        uVar5 = *(ulong *)(uVar8 + 0x20);
        if (uVar5 <= needed) {
          if (*(long *)(uVar8 + 0x30) == 0) {
            uVar5 = *(ulong *)(uVar8 + 0x28);
          }
          *(ulong *)(uVar8 + 0x28) = uVar5;
LAB_00120302:
          fio_str_capa_assert(&local_d8,s,needed);
        }
        *(ulong *)(uVar8 + 0x28) = needed;
        lVar9 = *(long *)(uVar8 + 0x38);
      }
      else {
        if (0x2d < needed) {
          s->small = '[';
          goto LAB_00120302;
        }
        *(char *)(uVar8 + 0x10) = (char)needed * '\x02' + '\x01';
        lVar9 = uVar8 + 0x12;
      }
      *(undefined1 *)(lVar9 + needed) = 0;
    }
    uVar5 = 0;
  }
  close(iVar1);
LAB_00120116:
  fio_free(__dest);
  return uVar5;
}

Assistant:

size_t fiobj_str_readfile(FIOBJ dest, const char *filename, intptr_t start_at,
                          intptr_t limit) {
  fio_str_info_s state =
      fio_str_readfile(&obj2str(dest)->str, filename, start_at, limit);
  return state.len;
}